

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

uint32_t float128_to_uint32_round_to_zero_riscv32(float128 a,float_status *status)

{
  char cVar1;
  byte bVar2;
  uint64_t uVar3;
  
  cVar1 = status->float_rounding_mode;
  bVar2 = status->float_exception_flags;
  status->float_rounding_mode = '\x03';
  uVar3 = float128_to_uint64_riscv32(a,status);
  status->float_rounding_mode = cVar1;
  if (uVar3 >> 0x20 != 0) {
    status->float_exception_flags = bVar2 | 1;
    uVar3 = 0xffffffff;
  }
  return (uint32_t)uVar3;
}

Assistant:

uint32_t float128_to_uint32_round_to_zero(float128 a, float_status *status)
{
    uint64_t v;
    uint32_t res;
    int old_exc_flags = get_float_exception_flags(status);

    v = float128_to_uint64_round_to_zero(a, status);
    if (v > 0xffffffff) {
        res = 0xffffffff;
    } else {
        return v;
    }
    set_float_exception_flags(old_exc_flags, status);
    float_raise(float_flag_invalid, status);
    return res;
}